

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_descriptor_handle.hpp
# Opt level: O1

void __thiscall
io::posix::file_descriptor_handle::~file_descriptor_handle(file_descriptor_handle *this)

{
  int iVar1;
  
  if (this->delete_ == true) {
    iVar1 = close(this->fd_);
    if (iVar1 != 0) {
      __assert_fail("close_return == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tcbrindle[P]modern-io/include/io/posix/file_descriptor_handle.hpp"
                    ,0x36,"io::posix::file_descriptor_handle::~file_descriptor_handle()");
    }
  }
  return;
}

Assistant:

~file_descriptor_handle() noexcept
    {
        if (delete_) {
#ifdef NDEBUG
            ::close(fd_);
#else // !NDEBUG
            int close_return = ::close(fd_);
            assert(close_return == 0);
#endif // NDEBUG
        }
    }